

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUnexpectedCommand.cxx
# Opt level: O0

bool __thiscall
cmUnexpectedCommand::InitialPass
          (cmUnexpectedCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_1,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  double dVar3;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  char *local_30;
  char *versionValue;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *param_1_local;
  cmUnexpectedCommand *this_local;
  
  this_00 = (this->super_cmCommand).Makefile;
  versionValue = &param_2->ReturnInvoked;
  param_2_local = (cmExecutionStatus *)param_1;
  param_1_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"CMAKE_MINIMUM_REQUIRED_VERSION",&local_51);
  pcVar2 = cmMakefile::GetDefinition(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_30 = pcVar2;
  bVar1 = std::operator==(&this->Name,"endif");
  if ((!bVar1) || ((local_30 != (char *)0x0 && (dVar3 = atof(local_30), 1.4 < dVar3)))) {
    pcVar2 = this->Error;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_88,pcVar2,&local_89);
    cmCommand::SetError(&this->super_cmCommand,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmUnexpectedCommand::InitialPass(std::vector<std::string> const&,
                                      cmExecutionStatus&)
{
  const char* versionValue =
    this->Makefile->GetDefinition("CMAKE_MINIMUM_REQUIRED_VERSION");
  if (this->Name == "endif" && (!versionValue || atof(versionValue) <= 1.4)) {
    return true;
  }

  this->SetError(this->Error);
  return false;
}